

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpAgent.cpp
# Opt level: O1

int __thiscall
HttpAgent::sendAndGet
          (HttpAgent *this,HttpRequest *req,HttpResponse *res,string *toSend,BodyHandler *handler)

{
  IReaderWriter *reader;
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ssize_t sVar6;
  char *pcVar7;
  uint8_t *puVar8;
  size_t __nbytes;
  string *__n;
  void *__buf;
  ErrCode EVar9;
  string *len;
  int __flags;
  BodyHandler *pBVar10;
  int buffer_len;
  int length;
  Address addr;
  URI uri;
  uint local_168;
  ErrCode local_164;
  string local_160;
  Socket *local_140;
  Address local_134;
  URI local_110;
  
  __n = toSend;
  pBVar10 = handler;
  URI::URI(&local_110,&req->mUri);
  __flags = (int)pBVar10;
  URI::getHost_abi_cxx11_(&local_160,&local_110);
  pcVar7 = (char *)CONCAT44(local_160._M_dataplus._M_p._4_4_,(uint)local_160._M_dataplus._M_p);
  iVar3 = URI::getPort(&local_110);
  local_134.mAddr.sin_family = 2;
  local_134.mAddr.sin_port = (ushort)iVar3 << 8 | (ushort)iVar3 >> 8;
  JetHead::Socket::Address::setAddress(&local_134,pcVar7);
  local_134.mLen = 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_160._M_dataplus._M_p._4_4_,(uint)local_160._M_dataplus._M_p) !=
      &local_160.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_160._M_dataplus._M_p._4_4_,(uint)local_160._M_dataplus._M_p),
                    local_160.field_2._M_allocated_capacity + 1);
  }
  local_140 = &this->mSock;
  (this->mSock).mReadTimeout = 5;
  iVar3 = JetHead::Socket::connect(local_140,(int)&local_134,(sockaddr *)0xa,(socklen_t)__n);
  if (iVar3 == 0) {
    reader = &(this->mSock).super_IReaderWriter;
    HttpHeaderBase::send((HttpHeaderBase *)req,(int)reader,__buf,(size_t)__n,__flags);
    if ((void *)toSend->_M_string_length != (void *)0x0) {
      sVar6 = JetHead::Socket::write
                        (local_140,(int)(toSend->_M_dataplus)._M_p,(void *)toSend->_M_string_length,
                         (size_t)__n);
      req = (HttpRequest *)0x0;
      EVar9 = kWriteFailed;
      if ((int)sVar6 != (int)toSend->_M_string_length) goto LAB_0011836d;
    }
    JetHead::CircularBuffer::clear(&this->mBuffer);
    len = (string *)CONCAT71((int7)((ulong)req >> 8),1);
    do {
      iVar3 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
      iVar3 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar3);
      if (iVar3 < 1) {
        EVar9 = kReadFailed;
        goto LAB_0011836d;
      }
      while (iVar3 = HttpHeaderBase::searchForLine(&this->mBuffer), 0 < iVar3) {
        pp_Var1 = (res->super_HttpHeader).super_HttpHeaderBase._vptr_HttpHeaderBase;
        if ((char)len == '\0') {
          uVar4 = (*pp_Var1[3])(res);
        }
        else {
          uVar4 = (*pp_Var1[2])(res);
          len = (string *)0x0;
        }
        if (-1 < (int)uVar4) {
          JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)uVar4,(size_t)__n);
        }
      }
      iVar3 = HttpHeaderBase::searchForLine(&this->mBuffer);
    } while ((iVar3 != 0) || (iVar3 = JetHead::CircularBuffer::getLength(&this->mBuffer), iVar3 < 2)
            );
    uVar4 = res->mResponseCode;
    JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x2,(size_t)__n);
    local_160._M_dataplus._M_p._0_4_ = 0;
    local_164 = HttpHeaderBase::getFieldInt((HttpHeaderBase *)res,0x3f4,(int32_t *)&local_160);
    if (local_164 == kNoError) {
      while (bVar2 = (int)(uint)local_160._M_dataplus._M_p < 1,
            0 < (int)(uint)local_160._M_dataplus._M_p) {
        puVar8 = JetHead::CircularBuffer::getBytes(&this->mBuffer,0,(int *)&local_168);
        __nbytes = (size_t)(uint)local_160._M_dataplus._M_p;
        if ((int)(uint)local_160._M_dataplus._M_p < (int)local_168) {
          local_168 = (uint)local_160._M_dataplus._M_p;
        }
        if (handler != (BodyHandler *)0x0) {
          __nbytes = *(size_t *)handler;
          (**(code **)(__nbytes + 0x10))(handler,puVar8,local_168);
        }
        JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)local_168,__nbytes);
        local_160._M_dataplus._M_p._0_4_ = (uint)local_160._M_dataplus._M_p - local_168;
        if ((uint)local_160._M_dataplus._M_p != 0) {
          uVar4 = (**(code **)(*(long *)handler + 0x18))(handler);
          if ((int)uVar4 < 0) break;
          local_160._M_dataplus._M_p._0_4_ = 0;
        }
      }
      EVar9 = kReadFailed;
      local_164 = kNoError;
    }
    else {
      pcVar7 = HttpHeaderBase::getField((HttpHeaderBase *)res,0x410);
      bVar2 = true;
      if ((pcVar7 != (char *)0x0) && (iVar3 = strcmp(pcVar7,"chunked"), iVar3 == 0)) {
        len = &local_160;
        while (uVar5 = parseChunkLine(&this->mBuffer,(int *)len), (int)uVar5 < 1) {
          iVar3 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
          uVar4 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar3);
          if ((int)uVar4 < 0) {
            len = (string *)0xd;
            bVar2 = false;
            jh_log_print(0,
                         "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                         ,0xd7,"Socket read failed...");
            goto LAB_0011835e;
          }
          iVar3 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
          if (iVar3 == 0xd) {
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
          }
          iVar3 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
          if (iVar3 == 10) {
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
          }
        }
        JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)uVar5,(size_t)__n);
        if ((int)(uint)local_160._M_dataplus._M_p < 1) {
          local_164 = kNoError;
        }
        else {
joined_r0x001184e7:
          do {
            if ((int)(uint)local_160._M_dataplus._M_p < 1) {
              iVar3 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
              uVar4 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar3);
              if ((int)uVar4 < 0) {
                len = (string *)0xd;
                bVar2 = false;
                __n = (string *)0x10c;
                jh_log_print(0,
                             "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                             ,0x10c,"Socket read failed...");
              }
              else {
                iVar3 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
                if (iVar3 == 0xd) {
                  JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
                }
                iVar3 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
                if (iVar3 == 10) {
                  JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
                }
                while (uVar5 = parseChunkLine(&this->mBuffer,(int *)&local_160), (int)uVar5 < 1) {
                  iVar3 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
                  uVar4 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,reader,iVar3);
                  if ((int)uVar4 < 0) {
                    len = (string *)0xd;
                    bVar2 = false;
                    __n = (string *)0x11a;
                    jh_log_print(0,
                                 "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                                 ,0x11a,"Socket read failed...");
                    goto LAB_001186bd;
                  }
                  iVar3 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
                  if (iVar3 == 0xd) {
                    JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
                  }
                  iVar3 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
                  if (iVar3 == 10) {
                    JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)__n);
                  }
                }
                bVar2 = true;
                JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)uVar5,(size_t)__n);
              }
            }
            else {
              JetHead::CircularBuffer::getBytes(&this->mBuffer,0,(int *)&local_168);
              if ((int)(uint)local_160._M_dataplus._M_p < (int)local_168) {
                local_168 = (uint)local_160._M_dataplus._M_p;
              }
              __n = (string *)
                    (ulong)CONCAT31((int3)((uint)local_160._M_dataplus._M_p >> 8),
                                    handler != (BodyHandler *)0x0);
              if (local_168 != 0 && handler != (BodyHandler *)0x0) {
                __n = *(string **)handler;
                (*(code *)(__n->field_2)._M_allocated_capacity)(handler);
                JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)local_168,(size_t)__n)
                ;
                local_160._M_dataplus._M_p._0_4_ = (uint)local_160._M_dataplus._M_p - local_168;
              }
              if ((uint)local_160._M_dataplus._M_p == 0) goto joined_r0x001184e7;
              uVar4 = (**(code **)(*(long *)handler + 0x18))(handler);
              if (0 < (int)uVar4) {
                local_160._M_dataplus._M_p._0_4_ = 0;
                goto joined_r0x001184e7;
              }
              uVar5 = uVar4;
              if (uVar4 != 0) {
                uVar5 = 0xd;
              }
              len = (string *)(ulong)uVar5;
              bVar2 = false;
            }
LAB_001186bd:
            if (!bVar2) goto LAB_0011835e;
          } while (0 < (int)(uint)local_160._M_dataplus._M_p);
          local_164 = kNoError;
        }
      }
LAB_0011835e:
      EVar9 = (ErrCode)len;
    }
    if (bVar2) {
      if (handler != (BodyHandler *)0x0) {
        (**(code **)(*(long *)handler + 0x20))(handler,1);
      }
      if ((uVar4 == 0xce) || (EVar9 = kNotFound, uVar4 == 200)) {
        EVar9 = local_164;
      }
    }
  }
  else {
    res->mResponseCode = -1;
    EVar9 = kConnectionFailed;
  }
LAB_0011836d:
  URI::~URI(&local_110);
  return EVar9;
}

Assistant:

int HttpAgent::sendAndGet( HttpRequest &req, HttpResponse &res, 
						   const std::string& toSend, BodyHandler* handler )
{
	URI uri = req.getURI();

	Socket::Address addr( uri.getHost().c_str(), uri.getPort() );
	bool first_line = true;
	int len;
	int ret;
	ErrCode err = kNoError;

	mSock.setReadTimeout( 5 );
	ret = mSock.connect( addr, 10 );

	if (ret != 0)
	{
		LOG_NOTICE("Socket connect failed...");
		res.setResponseCode(-1);
		return kConnectionFailed;
	}

	ret = req.send( &mSock );
	if (not toSend.empty())
	{
		if (mSock.write(toSend.c_str(), toSend.size()) != (int)toSend.size())
		{
			return kWriteFailed;
		}
	}

	mBuffer.clear();
	do
	{
		ret = mBuffer.fillFromFile(&mSock, mBuffer.getFreeSpace());

		if (ret <= 0)
		{
			LOG_NOTICE("Socket read failed...");
			return kReadFailed;
		}

		while (HttpHeaderBase::searchForLine(mBuffer) > 0)
		{
			if (first_line)
			{
				len = res.parseFirstLine(mBuffer);
				first_line = false;
			}
			else
			{
				len = res.parseLine(mBuffer);
			}

			if (len < 0)
			{
				LOG_NOTICE("Problem parsing response...");
			}
			else
			{
				mBuffer.read(NULL, len);
			}
		}
		
	} while (HttpHeaderBase::searchForLine(mBuffer) != HttpHeaderBase::kEOH or
			 mBuffer.getLength() < 2);

	ret = res.getResponseCode();

	// read \r\n from buffer
	mBuffer.read( NULL, 2 );			
	
	// Get Body of Response.

	int read_len, length = 0;	
	err = res.getFieldInt( HttpFieldMap::kFieldContentLength, length );
	if ( err == kNoError )
	{
		const char *buffer;
		int buffer_len;
		
		while ( length > 0 )
		{
			buffer = (const char *)mBuffer.getBytes( 0, buffer_len );
			
			if ( buffer_len > length )
				buffer_len = length;
			
			if ( handler != NULL )
				handler->handleData( buffer, buffer_len );
			
			mBuffer.read( NULL, buffer_len );
			length -= buffer_len;

			if (length)
			{
				ret = handler->handleSocket( mSock, length );	

				if (ret < 0)
					return kReadFailed;
				length = 0;
			}
		}
	}
	else
	{
		const char *encoding = res.getField( HttpFieldMap::kFieldTransferEncoding );

		if ( encoding != NULL && strcmp( encoding, "chunked" ) == 0 )
		{			
			while ((read_len = parseChunkLine( mBuffer, length )) <= 0)
			{
				ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );

				if (ret < 0)
				{
					LOG_ERR("Socket read failed...");
					return kReadFailed;
				}	

				if ( mBuffer.byteAt( 0 ) == '\r' )
					mBuffer.read( NULL, 1 );
				if ( mBuffer.byteAt( 0 ) == '\n' )
					mBuffer.read( NULL, 1 );
				
			}

			mBuffer.read( NULL, read_len );
			
			while ( length > 0 )
			{
				const char *buffer;
				int buffer_len;
			
				while ( length > 0 )
				{
					buffer = (const char *)mBuffer.getBytes( 0, buffer_len );
					
					if ( buffer_len > length )
						buffer_len = length;

					if ( (handler != NULL ) && (buffer_len) )
					{
						handler->handleData( buffer, buffer_len );
					
						mBuffer.read( NULL, buffer_len );
						length -= buffer_len;
					}

					if (length)
					{
						ret = handler->handleSocket( mSock, length );	

						if (ret <= 0)
						{
							if (ret == 0)
								return kNoError;
							else
								return kReadFailed;
						}
						length = 0;
					}

				}

				ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );

				if (ret < 0)
				{
					LOG_ERR("Socket read failed...");
					return kReadFailed;
				}

				if ( mBuffer.byteAt( 0 ) == '\r' )
					mBuffer.read( NULL, 1 );
				if ( mBuffer.byteAt( 0 ) == '\n' )
					mBuffer.read( NULL, 1 );

				while ((read_len = parseChunkLine( mBuffer, length )) <= 0)
				{
					ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );
					if (ret < 0)
					{
						LOG_ERR("Socket read failed...");
						return kReadFailed;
					}

					if ( mBuffer.byteAt( 0 ) == '\r' )
						mBuffer.read( NULL, 1 );
					if ( mBuffer.byteAt( 0 ) == '\n' )
						mBuffer.read( NULL, 1 );
				}

				mBuffer.read( NULL, read_len );
			}
			
			err = kNoError;
		}
	}

	if ( handler != NULL )
		handler->setStop(true);

	if ( !(( ret == 200 ) || ( ret == 206)) )
	{
		LOG_NOTICE("File not found... response code = %d", ret);
		return kNotFound;
	}

	return err;
}